

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboTestUtil::Texture3DShader::shadeFragments
          (Texture3DShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  float fVar1;
  DataType DVar2;
  GenericVec4 *pGVar3;
  int iVar4;
  int fragNdx_1;
  uint uVar5;
  float *pfVar6;
  FragmentPacket *packet;
  Vec4 *output;
  ulong uVar7;
  long lVar8;
  int fragNdx;
  uint uVar9;
  deUint32 dVar10;
  deUint32 dVar11;
  deUint32 dVar12;
  deUint32 dVar13;
  Vec4 coord;
  UVec4 uicolor;
  IVec4 icolor;
  Vec4 texBias;
  Vec4 texScale;
  Vec3 texCoords [4];
  Vec4 colors [4];
  deUint32 local_110;
  deUint32 dStack_10c;
  deUint32 local_108;
  deUint32 local_104;
  FragmentPacket *local_100;
  ulong local_f8;
  Texture3D *local_f0;
  deUint32 local_e8;
  deUint32 dStack_e4;
  deUint32 dStack_e0;
  deUint32 dStack_dc;
  deUint32 local_d8;
  deUint32 dStack_d4;
  deUint32 dStack_d0;
  deUint32 dStack_cc;
  Vector<float,_4> local_c8;
  Vector<float,_4> local_b8;
  Vec3 local_a8 [4];
  Vec4 local_78 [4];
  
  local_100 = packets;
  tcu::Vector<float,_4>::Vector
            (&local_b8,
             (float (*) [4])
             &(this->super_ShaderProgram).m_uniforms.
              super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
              super__Vector_impl_data._M_start[1].value);
  tcu::Vector<float,_4>::Vector
            (&local_c8,
             (float (*) [4])
             &(this->super_ShaderProgram).m_uniforms.
              super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
              super__Vector_impl_data._M_start[2].value);
  fVar1 = (float)(this->super_ShaderProgram).m_uniforms.
                 super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
                 super__Vector_impl_data._M_start[3].value.i;
  lVar8 = 0;
  do {
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)local_a8[0].m_data + lVar8));
    lVar8 = lVar8 + 0xc;
  } while (lVar8 != 0x30);
  lVar8 = 0;
  do {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)local_78[0].m_data + lVar8));
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x40);
  uVar7 = 0;
  local_f8 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    local_f8 = uVar7;
  }
  do {
    if (uVar7 == local_f8) {
      return;
    }
    local_f0 = (((this->super_ShaderProgram).m_uniforms.
                 super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
                 super__Vector_impl_data._M_start)->sampler).tex3D;
    packet = local_100 + uVar7;
    pfVar6 = local_a8[0].m_data + 2;
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      rr::readTriangleVarying<float>((rr *)&local_110,packet,context,0,(int)lVar8);
      *(ulong *)((Vec3 *)(pfVar6 + -2))->m_data = CONCAT44(dStack_10c,local_110);
      *pfVar6 = fVar1;
      pfVar6 = pfVar6 + 3;
    }
    output = local_78;
    sglr::rc::Texture3D::sample4(local_f0,output,local_a8,0.0);
    uVar9 = (int)uVar7 * 4;
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      tcu::operator*((tcu *)&local_d8,output,&local_b8);
      tcu::operator+((tcu *)&local_110,(Vector<float,_4> *)&local_d8,&local_c8);
      castVectorSaturate<int>((Vec4 *)&local_110);
      castVectorSaturate<unsigned_int>((Vec4 *)&local_110);
      DVar2 = this->m_outputType;
      uVar5 = (uint)lVar8;
      if (DVar2 == TYPE_UINT_VEC4) {
        pGVar3 = context->outputArray;
        iVar4 = (uVar5 | uVar9) * context->numFragmentOutputs;
        dVar10 = local_e8;
        dVar11 = dStack_e4;
        dVar12 = dStack_e0;
        dVar13 = dStack_dc;
LAB_0069d588:
        pGVar3 = pGVar3 + iVar4;
        (pGVar3->v).uData[0] = dVar10;
        (pGVar3->v).uData[1] = dVar11;
        (pGVar3->v).uData[2] = dVar12;
        (pGVar3->v).uData[3] = dVar13;
      }
      else {
        if (DVar2 == TYPE_INT_VEC4) {
          pGVar3 = context->outputArray;
          iVar4 = (uVar5 | uVar9) * context->numFragmentOutputs;
          dVar10 = local_d8;
          dVar11 = dStack_d4;
          dVar12 = dStack_d0;
          dVar13 = dStack_cc;
          goto LAB_0069d588;
        }
        if (DVar2 == TYPE_FLOAT_VEC4) {
          pGVar3 = context->outputArray;
          iVar4 = (uVar5 | uVar9) * context->numFragmentOutputs;
          pGVar3[iVar4].v.uData[0] = local_110;
          pGVar3[iVar4].v.uData[1] = dStack_10c;
          pGVar3[iVar4].v.uData[2] = local_108;
          pGVar3[iVar4].v.uData[3] = local_104;
        }
      }
      output = output + 1;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void Texture3DShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 texScale	(m_uniforms[1].value.f4);
	const tcu::Vec4 texBias		(m_uniforms[2].value.f4);
	const float		depth		= m_uniforms[3].value.f;

	tcu::Vec3 texCoords[4];
	tcu::Vec4 colors[4];

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const sglr::rc::Texture3D* tex = m_uniforms[0].sampler.tex3D;

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4	coord = rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
			texCoords[fragNdx] = tcu::Vec3(coord.x(), coord.y(), depth);
		}

		tex->sample4(colors, texCoords);

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4		color	= colors[fragNdx] * texScale + texBias;
			const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
			const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

			if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
			else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
			else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
			else
				DE_ASSERT(DE_FALSE);
		}
	}
}